

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRFromMemory(float **out_rgba,int *width,int *height,uchar *memory,size_t size,char **err)

{
  undefined4 uVar1;
  char cVar2;
  uchar **ppuVar3;
  int it;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  float *pfVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int i;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  float fVar23;
  EXRImage exr_image;
  string local_378;
  EXRVersion exr_version;
  EXRHeader exr_header;
  stringstream ss;
  ostream local_1a8 [376];
  
  if (out_rgba == (float **)0x0 || memory == (uchar *)0x0) {
    std::__cxx11::string::string
              ((string *)&exr_header,"Invalid argument for LoadEXRFromMemory",(allocator *)&ss);
    tinyexr::SetErrorMessage((string *)&exr_header,err);
    std::__cxx11::string::~string((string *)&exr_header);
    return -3;
  }
  memset(&exr_header,0,0x188);
  iVar4 = ParseEXRVersionFromMemory(&exr_version,memory,size);
  if (iVar4 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<(local_1a8,"Failed to parse EXR version. code(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    std::operator<<(poVar5,")");
    std::__cxx11::stringbuf::str();
    tinyexr::SetErrorMessage(&local_378,err);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return iVar4;
  }
  iVar4 = ParseEXRHeaderFromMemory(&exr_header,&exr_version,memory,size,err);
  if (iVar4 != 0) {
    return iVar4;
  }
  for (lVar6 = 0; lVar6 < exr_header.num_channels; lVar6 = lVar6 + 1) {
    if (exr_header.pixel_types[lVar6] == 1) {
      exr_header.requested_pixel_types[lVar6] = 2;
    }
  }
  exr_image.width = 0;
  exr_image.height = 0;
  exr_image.num_channels = 0;
  exr_image.num_tiles = 0;
  exr_image.level_x = 0;
  exr_image.level_y = 0;
  exr_image.images = (uchar **)0x0;
  exr_image.tiles = (EXRTile *)0x0;
  exr_image.next_level = (TEXRImage *)0x0;
  iVar4 = LoadEXRImageFromMemory(&exr_image,&exr_header,memory,size,err);
  if (iVar4 != 0) {
    return iVar4;
  }
  uVar9 = 0;
  uVar13 = 0;
  if (0 < exr_header.num_channels) {
    uVar13 = (ulong)(uint)exr_header.num_channels;
  }
  pcVar8 = (exr_header.channels)->name + 1;
  uVar10 = 0xffffffffffffffff;
  uVar11 = 0xffffffff;
  uVar22 = 0xffffffff;
  uVar20 = 0xffffffff;
  for (; uVar13 != uVar9; uVar9 = uVar9 + 1) {
    cVar2 = ((EXRChannelInfo *)(pcVar8 + -1))->name[0];
    if (cVar2 == 'R') {
      if (*pcVar8 == '\0') {
        uVar20 = uVar9 & 0xffffffff;
      }
    }
    else if (cVar2 == 'A') {
      uVar10 = uVar10 & 0xffffffff;
      if (*pcVar8 == '\0') {
        uVar10 = uVar9 & 0xffffffff;
      }
    }
    else if (cVar2 == 'B') {
      if (*pcVar8 == '\0') {
        uVar11 = uVar9 & 0xffffffff;
      }
    }
    else if ((cVar2 == 'G') && (*pcVar8 == '\0')) {
      uVar22 = uVar9 & 0xffffffff;
    }
    pcVar8 = pcVar8 + 0x110;
  }
  if (exr_header.num_channels == 1) {
    uVar9 = (ulong)exr_image.width;
    uVar13 = (ulong)exr_image.height;
    pfVar7 = (float *)malloc(uVar9 * uVar13 * 0x10);
    *out_rgba = pfVar7;
    if (exr_header.tiled == 0) {
      lVar6 = 0;
      for (lVar16 = 0; lVar16 < (int)uVar13 * (int)uVar9; lVar16 = lVar16 + 1) {
        uVar1 = *(undefined4 *)(*exr_image.images + lVar16 * 4);
        *(undefined4 *)((long)*out_rgba + lVar6) = uVar1;
        *(undefined4 *)((long)*out_rgba + lVar6 + 4) = uVar1;
        *(undefined4 *)((long)*out_rgba + lVar6 + 8) = uVar1;
        *(undefined4 *)((long)*out_rgba + lVar6 + 0xc) = uVar1;
        uVar9 = exr_image._32_8_ & 0xffffffff;
        uVar13 = (ulong)(uint)exr_image.height;
        lVar6 = lVar6 + 0x10;
      }
    }
    else {
      for (lVar6 = 0; lVar6 < exr_image.num_tiles; lVar6 = lVar6 + 1) {
        for (iVar4 = 0; iVar4 < exr_header.tile_size_y; iVar4 = iVar4 + 1) {
          for (iVar12 = 0; iVar12 < exr_header.tile_size_x; iVar12 = iVar12 + 1) {
            iVar14 = exr_image.tiles[lVar6].offset_x * exr_header.tile_size_x + iVar12;
            if ((iVar14 < exr_image.width) &&
               (iVar18 = exr_header.tile_size_y * exr_image.tiles[lVar6].offset_y + iVar4,
               iVar18 < exr_image.height)) {
              iVar14 = iVar14 + exr_image.width * iVar18;
              ppuVar3 = exr_image.tiles[lVar6].images;
              lVar16 = (long)(exr_header.tile_size_x * iVar4 + iVar12);
              (*out_rgba)[iVar14 * 4] = *(float *)(*ppuVar3 + lVar16 * 4);
              (*out_rgba)[iVar14 * 4 + 1] = *(float *)(*ppuVar3 + lVar16 * 4);
              (*out_rgba)[iVar14 * 4 + 2] = *(float *)(*ppuVar3 + lVar16 * 4);
              (*out_rgba)[iVar14 * 4 + 3] = *(float *)(*ppuVar3 + lVar16 * 4);
            }
          }
        }
      }
    }
LAB_001ae43a:
    *width = exr_image.width;
    *height = exr_image.height;
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    iVar4 = 0;
  }
  else {
    iVar4 = (int)uVar20;
    if (iVar4 == -1) {
      pcVar8 = "R channel not found";
    }
    else {
      iVar12 = (int)uVar22;
      if (iVar12 == -1) {
        pcVar8 = "G channel not found";
      }
      else {
        iVar14 = (int)uVar11;
        if (iVar14 != -1) {
          uVar9 = (ulong)exr_image.width;
          uVar13 = (ulong)exr_image.height;
          pfVar7 = (float *)malloc(uVar9 * uVar13 * 0x10);
          *out_rgba = pfVar7;
          iVar18 = (int)uVar10;
          if (exr_header.tiled == 0) {
            lVar6 = 0;
            for (lVar16 = 0; lVar16 < (int)uVar13 * (int)uVar9; lVar16 = lVar16 + 1) {
              (*out_rgba)[lVar6] = *(float *)(exr_image.images[iVar4] + lVar6);
              (*out_rgba)[lVar6 + 1] = *(float *)(exr_image.images[iVar12] + lVar6);
              (*out_rgba)[lVar6 + 2] = *(float *)(exr_image.images[iVar14] + lVar6);
              fVar23 = 1.0;
              if (iVar18 != -1) {
                fVar23 = *(float *)(exr_image.images[iVar18] + lVar6);
              }
              (*out_rgba)[lVar6 + 3] = fVar23;
              uVar9 = exr_image._32_8_ & 0xffffffff;
              uVar13 = (ulong)(uint)exr_image.height;
              lVar6 = lVar6 + 4;
            }
          }
          else {
            for (lVar6 = 0; lVar6 < exr_image.num_tiles; lVar6 = lVar6 + 1) {
              for (iVar15 = 0; iVar15 < exr_header.tile_size_y; iVar15 = iVar15 + 1) {
                for (iVar17 = 0; iVar17 < exr_header.tile_size_x; iVar17 = iVar17 + 1) {
                  iVar19 = exr_image.tiles[lVar6].offset_x * exr_header.tile_size_x + iVar17;
                  if ((iVar19 < exr_image.width) &&
                     (iVar21 = exr_header.tile_size_y * exr_image.tiles[lVar6].offset_y + iVar15,
                     iVar21 < exr_image.height)) {
                    iVar19 = iVar19 + exr_image.width * iVar21;
                    ppuVar3 = exr_image.tiles[lVar6].images;
                    lVar16 = (long)(exr_header.tile_size_x * iVar15 + iVar17);
                    (*out_rgba)[iVar19 * 4] = *(float *)(ppuVar3[iVar4] + lVar16 * 4);
                    (*out_rgba)[iVar19 * 4 + 1] = *(float *)(ppuVar3[iVar12] + lVar16 * 4);
                    (*out_rgba)[iVar19 * 4 + 2] = *(float *)(ppuVar3[iVar14] + lVar16 * 4);
                    fVar23 = 1.0;
                    if (iVar18 != -1) {
                      fVar23 = *(float *)(ppuVar3[iVar18] + lVar16 * 4);
                    }
                    (*out_rgba)[(int)(iVar19 * 4 | 3)] = fVar23;
                  }
                }
              }
            }
          }
          goto LAB_001ae43a;
        }
        pcVar8 = "B channel not found";
      }
    }
    std::__cxx11::string::string((string *)&ss,pcVar8,(allocator *)&local_378);
    tinyexr::SetErrorMessage((string *)&ss,err);
    std::__cxx11::string::~string((string *)&ss);
    iVar4 = -4;
  }
  return iVar4;
}

Assistant:

int LoadEXRFromMemory(float **out_rgba, int *width, int *height,
                      const unsigned char *memory, size_t size,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory, size);
  if (ret != TINYEXR_SUCCESS) {
    std::stringstream ss;
    ss << "Failed to parse EXR version. code(" << ret << ")";
    tinyexr::SetErrorMessage(ss.str(), err);
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  // TODO(syoyo): Refactor removing same code as used in LoadEXR().
  if (exr_header.num_channels == 1) {
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[0][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val = reinterpret_cast<float **>(exr_image.images)[0][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }

  } else {
    // TODO(syoyo): Support non RGBA image.

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++)
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}